

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O0

void __thiscall
TPZCompElHDiv<pzshape::TPZShapePrism>::SetConnectIndex
          (TPZCompElHDiv<pzshape::TPZShapePrism> *this,int i,int64_t connectindex)

{
  int iVar1;
  ostream *poVar2;
  long *plVar3;
  long in_RDX;
  int in_ESI;
  long *in_RDI;
  size_t in_stack_000003e8;
  char *in_stack_000003f0;
  
  if ((-1 < in_ESI) && (iVar1 = (**(code **)(*in_RDI + 0x90))(), in_ESI < iVar1)) {
    plVar3 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x18),(long)in_ESI);
    *plVar3 = in_RDX;
    return;
  }
  poVar2 = std::operator<<((ostream *)&std::cout," TPZCompElHDiv<TSHAPE>::SetConnectIndex index ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
  std::operator<<(poVar2," out of range\n");
  pzinternal::DebugStopImpl(in_stack_000003f0,in_stack_000003e8);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::SetConnectIndex(int i, int64_t connectindex){
#ifndef PZNODEBUG
	if(i<0 || i>= this->NConnects()) {
		std::cout << " TPZCompElHDiv<TSHAPE>::SetConnectIndex index " << i <<
		" out of range\n";
		DebugStop();
		return;
	}
#endif
	this-> fConnectIndexes[i] = connectindex;
#ifdef PZ_LOG
    if (logger.isDebugEnabled())
	{
		std::stringstream sout;
		sout << endl<<"Setting Connect : " << i << " to connectindex " << connectindex<<std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
}